

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O1

int it_old_psm_read_patterns(IT_PATTERN *pattern,DUMBFILE *f,int num,int size,int pchans)

{
  ushort *puVar1;
  long lVar2;
  int32 iVar3;
  uint uVar4;
  int iVar5;
  char *ptr;
  IT_ENTRY *pIVar6;
  uint uVar7;
  ushort *puVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  ushort *puVar12;
  ushort *puVar13;
  uint uVar14;
  IT_PATTERN *pIVar15;
  bool bVar16;
  
  ptr = (char *)malloc((long)size);
  if (ptr == (char *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar3 = dumbfile_getnc(ptr,size,f);
    iVar5 = -1;
    if (size <= iVar3) {
      if (0 < num) {
        uVar10 = 0;
        iVar5 = 0;
        do {
          iVar9 = 3;
          if (iVar5 < size) {
            pIVar15 = pattern + uVar10;
            if ((ptr[(long)iVar5 + 2] == 0) || (ptr[(long)iVar5 + 3] == '\0')) {
              pIVar15->n_rows = 1;
              pIVar15->n_entries = 0;
              iVar9 = 6;
            }
            else {
              puVar13 = (ushort *)(ptr + iVar5);
              uVar4 = *puVar13 + 0xf & 0xfffffff0;
              puVar1 = (ushort *)((ulong)uVar4 + (long)puVar13);
              uVar14 = (uint)(byte)ptr[(long)iVar5 + 2];
              pIVar15->n_rows = uVar14;
              pIVar15->n_entries = uVar14;
              if (uVar4 != 0) {
                uVar7 = 0;
                bVar16 = true;
                puVar12 = puVar13 + 2;
                do {
                  while( true ) {
                    puVar8 = (ushort *)((long)puVar12 + 1);
                    bVar11 = (byte)*puVar12;
                    if (bVar11 != 0) break;
                    uVar7 = uVar7 + 1;
                    bVar16 = uVar7 < uVar14;
                    if ((!bVar16) || (puVar12 = puVar8, puVar1 <= puVar8)) goto LAB_006e4a95;
                  }
                  if (0x1f < bVar11) {
                    pIVar15->n_entries = pIVar15->n_entries + 1;
                    if ((char)bVar11 < '\0') {
                      puVar8 = (ushort *)((long)puVar12 + 3);
                    }
                    puVar8 = (ushort *)((long)puVar8 + (ulong)((bVar11 >> 6 & 1) != 0));
                    if ((bVar11 & 0x20) != 0) {
                      if (*(byte *)((long)puVar8 + 1) == 0x28) {
                        puVar8 = puVar8 + 2;
                      }
                      else {
                        puVar8 = puVar8 + 1;
                      }
                    }
                  }
                  puVar12 = puVar8;
                } while ((bool)(bVar16 & puVar8 < puVar1));
              }
LAB_006e4a95:
              pIVar6 = (IT_ENTRY *)malloc((long)pIVar15->n_entries * 7);
              if (pIVar6 != (IT_ENTRY *)0x0) {
                pIVar15->entry = pIVar6;
                if (uVar4 != 0) {
                  uVar7 = 0;
                  bVar16 = true;
                  puVar13 = puVar13 + 2;
LAB_006e4ad4:
                  do {
                    puVar12 = (ushort *)((long)puVar13 + 1);
                    bVar11 = (byte)*puVar13;
                    if (bVar11 == 0) goto LAB_006e4d78;
                    if (bVar11 < 0x20) goto LAB_006e4d63;
                    pIVar6->mask = '\0';
                    pIVar6->channel = (uchar)(bVar11 & 0x1f);
                    if ((char)bVar11 < '\0') {
                      if (((int)(bVar11 & 0x1f) < pchans) && (*(byte *)puVar12 < 0x3c)) {
                        pIVar6->mask = '\x01';
                        pIVar6->note = *(byte *)puVar12 + 0x23;
                      }
                      if ((byte)puVar13[1] != 0) {
                        pIVar6->mask = pIVar6->mask | 2;
                        pIVar6->instrument = (byte)puVar13[1];
                      }
                      puVar12 = (ushort *)((long)puVar13 + 3);
                    }
                    if ((bVar11 & 0x40) != 0) {
                      if ((byte)*puVar12 < 0x41) {
                        pIVar6->mask = pIVar6->mask | 4;
                        pIVar6->volpan = (byte)*puVar12;
                      }
                      puVar12 = (ushort *)((long)puVar12 + 1);
                    }
                    if ((bVar11 & 0x20) == 0) goto LAB_006e4d57;
                    bVar11 = pIVar6->mask;
                    pIVar6->mask = bVar11 | 8;
                    switch((byte)*puVar12) {
                    case 1:
                      pIVar6->effect = '\x1e';
                      goto LAB_006e4d4a;
                    case 2:
                      pIVar6->effect = '\x04';
                      goto LAB_006e4c92;
                    case 3:
                      pIVar6->effect = '\x1d';
                      goto LAB_006e4d4a;
                    case 4:
                      pIVar6->effect = '\x04';
                      goto LAB_006e4ce1;
                    default:
                      pIVar6->mask = bVar11 & 0xf7;
                      goto LAB_006e4d53;
                    case 10:
                      pIVar6->effect = '\x06';
                      bVar11 = *(byte *)((long)puVar12 + 1) | 0xf0;
                      break;
                    case 0xb:
                      pIVar6->effect = '\x06';
                      goto LAB_006e4d4a;
                    case 0xc:
                      pIVar6->effect = '\x05';
                      bVar11 = *(byte *)((long)puVar12 + 1) << 4 | 0xf;
                      break;
                    case 0xd:
                      pIVar6->effect = '\x05';
                      goto LAB_006e4d4a;
                    case 0xe:
                      pIVar6->effect = '\a';
                      goto LAB_006e4d4a;
                    case 0xf:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0x10;
                      break;
                    case 0x10:
                      pIVar6->effect = '\f';
                      goto LAB_006e4c92;
                    case 0x11:
                      pIVar6->effect = '\f';
                      goto LAB_006e4ce1;
                    case 0x14:
                      pIVar6->effect = '\b';
                      goto LAB_006e4d4a;
                    case 0x15:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xb | 0x30;
                      break;
                    case 0x16:
                      pIVar6->effect = '\v';
LAB_006e4c92:
                      bVar11 = *(byte *)((long)puVar12 + 1) << 4;
                      break;
                    case 0x17:
                      pIVar6->effect = '\v';
LAB_006e4ce1:
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf;
                      break;
                    case 0x1e:
                      pIVar6->effect = '\x12';
                      goto LAB_006e4d4a;
                    case 0x1f:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xb | 0x40;
                      break;
                    case 0x28:
                      pIVar6->effect = '\x0f';
                      bVar11 = (byte)puVar12[1];
                      puVar12 = puVar12 + 1;
                      break;
                    case 0x29:
                      pIVar6->effect = '\x1f';
                      goto LAB_006e4d4a;
                    case 0x2a:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0xc0;
                      break;
                    case 0x2b:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0xd0;
                      break;
                    case 0x32:
                      pIVar6->effect = '\x02';
                      goto LAB_006e4d4a;
                    case 0x33:
                      pIVar6->effect = '\x03';
                      goto LAB_006e4d4a;
                    case 0x34:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0xb0;
                      break;
                    case 0x35:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0xe0;
                      break;
                    case 0x3c:
                      pIVar6->effect = '\x01';
                      goto LAB_006e4d4a;
                    case 0x3d:
                      pIVar6->effect = '\x14';
                      goto LAB_006e4d4a;
                    case 0x46:
                      pIVar6->effect = '\n';
LAB_006e4d4a:
                      bVar11 = *(byte *)((long)puVar12 + 1);
                      break;
                    case 0x47:
                      pIVar6->effect = '\x13';
                      bVar11 = *(byte *)((long)puVar12 + 1) & 0xf | 0x20;
                      break;
                    case 0x48:
                      pIVar6->effect = '\x18';
                      lVar2 = (long)(int)((((int)((uint)*(byte *)((long)puVar12 + 1) << 0x1c) >>
                                           0x1f) + (uint)*(byte *)((long)puVar12 + 1)) * 0x20) *
                              0x92492493;
                      pIVar6->effectvalue =
                           (char)(uint)((ulong)lVar2 >> 0x22) - (char)(lVar2 >> 0x3f);
                      goto LAB_006e4d53;
                    }
                    pIVar6->effectvalue = bVar11;
LAB_006e4d53:
                    puVar12 = puVar12 + 1;
LAB_006e4d57:
                    if (pIVar6->mask != '\0') {
                      pIVar6 = pIVar6 + 1;
                    }
LAB_006e4d63:
                    puVar13 = puVar12;
                  } while ((bool)(bVar16 & puVar12 < puVar1));
                }
LAB_006e4d92:
                pIVar15->n_entries = ((int)pIVar6 - *(int *)&pIVar15->entry) * -0x49249249;
                iVar5 = uVar4 + iVar5;
                iVar9 = 0;
              }
            }
          }
          if ((iVar9 != 0) && (iVar9 != 6)) {
            iVar5 = -1;
            if (iVar9 != 3) {
              return -1;
            }
            goto LAB_006e4dfb;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)num);
      }
      iVar5 = 0;
    }
LAB_006e4dfb:
    free(ptr);
  }
  return iVar5;
LAB_006e4d78:
  pIVar6->channel = 0xff;
  pIVar6 = pIVar6 + 1;
  uVar7 = uVar7 + 1;
  bVar16 = uVar7 < uVar14;
  if ((!bVar16) || (puVar13 = puVar12, puVar1 <= puVar12)) goto LAB_006e4d92;
  goto LAB_006e4ad4;
}

Assistant:

static int it_old_psm_read_patterns(IT_PATTERN * pattern, DUMBFILE * f, int num, int size, int pchans)
{
	int n, offset, psize, rows, chans, row, flags, channel;

	unsigned char * buffer, * ptr, * end;

	IT_ENTRY * entry;

	buffer = malloc(size);
	if (!buffer) goto error;

    if (dumbfile_getnc((char *)buffer, size, f) < size) goto error_fb;

	offset = 0;

	for (n = 0; n < num; n++) {
		IT_PATTERN * p = &pattern[n];

		if (offset >= size) goto error_fb;

		ptr = buffer + offset;
		psize = ptr[0] | (ptr[1] << 8);
		rows = ptr[2];
		chans = ptr[3];

		if (!rows || !chans) {
			p->n_rows = 1;
			p->n_entries = 0;
			continue;
		}

		psize = (psize + 15) & ~15;

		end = ptr + psize;
		ptr += 4;

		p->n_rows = rows;
		p->n_entries = rows;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				row++;
				continue;
			}
			if (flags & 0xE0) {
				p->n_entries++;
				if (flags & 0x80) ptr += 2;
				if (flags & 0x40) ptr++;
				if (flags & 0x20) {
					ptr++;
					if (*ptr == 40) ptr += 3;
					else ptr++;
				}
			}
		}

		entry = malloc(p->n_entries * sizeof(*p->entry));
		if (!entry) goto error_fb;

		p->entry = entry;

		ptr = buffer + offset + 4;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				IT_SET_END_ROW(entry);
				entry++;
				row++;
				continue;
			}
			if (flags & 0xE0) {
				entry->mask = 0;
				entry->channel = channel = flags & 0x1F;
				if (channel >= chans)
				{
					//channel = 0;
					//goto error_fb;
				}
				if (flags & 0x80) {
					if ((*ptr < 60) && (channel < pchans)) {
						entry->mask |= IT_ENTRY_NOTE;
						entry->note = *ptr + 35;
					}
					ptr++;
					if (*ptr) {
						entry->mask |= IT_ENTRY_INSTRUMENT;
						entry->instrument = *ptr;
					}
					ptr++;
				}
				if (flags & 0x40) {
					if (*ptr <= 64) {
						entry->mask |= IT_ENTRY_VOLPAN;
						entry->volpan = *ptr;
					}
					ptr++;
				}
				if (flags & 0x20) {
					entry->mask |= IT_ENTRY_EFFECT;

					switch (*ptr) {
						case 1:
							entry->effect = IT_XM_FINE_VOLSLIDE_UP;
							entry->effectvalue = ptr[1];
							break;

						case 2:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = (ptr[1] << 4) & 0xF0;
							break;

						case 3:
							entry->effect = IT_XM_FINE_VOLSLIDE_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 4:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 10:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = EFFECT_VALUE(0xF, ptr[1]);
							break;

						case 11:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = ptr[1];
							break;

						case 12:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = EFFECT_VALUE(ptr[1], 0xF);
							break;

						case 13:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 14:
							entry->effect = IT_TONE_PORTAMENTO;
							entry->effectvalue = ptr[1];
							break;

						case 15:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_GLISSANDO_CONTROL, ptr[1] & 15);
							break;

						case 16:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 17:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 20:
							entry->effect = IT_VIBRATO;
							entry->effectvalue = ptr[1];
							break;

						case 21:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_VIBRATO_WAVEFORM, ptr[1] & 11);
							break;

						case 22:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 23:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 30:
							entry->effect = IT_TREMOLO;
							entry->effectvalue = ptr[1];
							break;

						case 31:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_TREMOLO_WAVEFORM, ptr[1] & 11);
							break;

						case 40:
							entry->effect = IT_SET_SAMPLE_OFFSET;
							entry->effectvalue = ptr[2];
							ptr += 2;
							break;

						case 41:
							entry->effect = IT_XM_RETRIGGER_NOTE;
							entry->effectvalue = ptr[1];
							break;

						case 42:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_DELAYED_NOTE_CUT, ptr[1] & 0xF);
							break;

						case 43:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_NOTE_DELAY, ptr[1] & 0xF);
							break;

						case 50:
							entry->effect = IT_JUMP_TO_ORDER;
							entry->effectvalue = ptr[1];
							break;

						case 51:
							entry->effect = IT_BREAK_TO_ROW;
							entry->effectvalue = ptr[1];
							break;

						case 52:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_LOOP, ptr[1] & 0xF);
							break;

						case 53:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_DELAY, ptr[1] & 0xF);
							break;

						case 60:
							entry->effect = IT_SET_SPEED;
							entry->effectvalue = ptr[1];
							break;

						case 61:
							entry->effect = IT_SET_SONG_TEMPO;
							entry->effectvalue = ptr[1];
							break;

						case 70:
							entry->effect = IT_ARPEGGIO;
							entry->effectvalue = ptr[1];
							break;

						case 71:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_FINETUNE, ptr[1] & 0xF);
							break;

						case 72:
							/* "balance" ... panning? */
							entry->effect = IT_SET_PANNING;
							entry->effectvalue = ((ptr[1] - ((ptr[1] & 8) >> 3)) << 5) / 7;
							break;

						default:
							entry->mask &= ~IT_ENTRY_EFFECT;
					}

					ptr += 2;
				}
				if (entry->mask) entry++;
			}
		}

		p->n_entries = (int)(entry - p->entry);
		offset += psize;
	}

	free(buffer);

	return 0;

error_fb:
	free(buffer);
error:
	return -1;
}